

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::RedeferFunctionObjectTypes(FunctionBody *this)

{
  undefined8 *puVar1;
  int *piVar2;
  ScriptFunctionType *pSVar3;
  code *pcVar4;
  bool bVar5;
  void *pvVar6;
  undefined4 *puVar7;
  long lVar8;
  
  pvVar6 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,FunctionObjectTypeList);
  if ((pvVar6 != (void *)0x0) && (0 < *(int *)((long)pvVar6 + 0x10))) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar8 = 0;
    do {
      puVar1 = *(undefined8 **)(*(long *)((long)pvVar6 + 8) + lVar8 * 8);
      if ((((ulong)puVar1 & 1) == 0 && puVar1 != (undefined8 *)0x0) &&
         (piVar2 = (int *)*puVar1, piVar2 != (int *)0x0)) {
        if (*piVar2 != 0x1b) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                      ,0x3f3,"(functionType->GetTypeId() == TypeIds_Function)",
                                      "functionType->GetTypeId() == TypeIds_Function");
          if (!bVar5) goto LAB_00767939;
          *puVar7 = 0;
        }
        bVar5 = CrossSite::IsThunk(*(JavascriptMethod *)(piVar2 + 6));
        if (!bVar5) {
          *(JavascriptMethod *)(piVar2 + 6) =
               ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               DeferredParsingThunk;
        }
        bVar5 = CrossSite::IsThunk(*(JavascriptMethod *)(*(long *)(piVar2 + 0xe) + 0x10));
        if (!bVar5) {
          *(JavascriptMethod *)(*(long *)(piVar2 + 0xe) + 0x10) =
               ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               DeferredParsingThunk;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)((long)pvVar6 + 0x10));
  }
  pSVar3 = (this->super_ParseableFunctionInfo).super_FunctionProxy.deferredPrototypeType.ptr;
  if (pSVar3 != (ScriptFunctionType *)0x0) {
    if ((pSVar3->super_DynamicType).super_Type.typeId != TypeIds_Function) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x3f3,"(functionType->GetTypeId() == TypeIds_Function)",
                                  "functionType->GetTypeId() == TypeIds_Function");
      if (!bVar5) goto LAB_00767939;
      *puVar7 = 0;
    }
    bVar5 = CrossSite::IsThunk((JavascriptMethod)(pSVar3->super_DynamicType).super_Type.entryPoint);
    if (!bVar5) {
      (pSVar3->super_DynamicType).super_Type.entryPoint =
           (Type)((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                 DeferredParsingThunk;
    }
    bVar5 = CrossSite::IsThunk((JavascriptMethod)((pSVar3->entryPointInfo).ptr)->jsMethod);
    if (!bVar5) {
      ((pSVar3->entryPointInfo).ptr)->jsMethod =
           (Type)((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                 DeferredParsingThunk;
    }
  }
  pSVar3 = (this->super_ParseableFunctionInfo).super_FunctionProxy.undeferredFunctionType.ptr;
  if (pSVar3 != (ScriptFunctionType *)0x0) {
    if ((pSVar3->super_DynamicType).super_Type.typeId != TypeIds_Function) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x3f3,"(functionType->GetTypeId() == TypeIds_Function)",
                                  "functionType->GetTypeId() == TypeIds_Function");
      if (!bVar5) {
LAB_00767939:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
    bVar5 = CrossSite::IsThunk((JavascriptMethod)(pSVar3->super_DynamicType).super_Type.entryPoint);
    if (!bVar5) {
      (pSVar3->super_DynamicType).super_Type.entryPoint =
           (Type)((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                 DeferredParsingThunk;
    }
    bVar5 = CrossSite::IsThunk((JavascriptMethod)((pSVar3->entryPointInfo).ptr)->jsMethod);
    if (!bVar5) {
      ((pSVar3->entryPointInfo).ptr)->jsMethod =
           (Type)((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                 DeferredParsingThunk;
    }
  }
  return;
}

Assistant:

void FunctionBody::RedeferFunctionObjectTypes()
    {
        this->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            Assert(functionType->GetTypeId() == TypeIds_Function);

            if (!CrossSite::IsThunk(functionType->GetEntryPoint()))
            {
                functionType->SetEntryPoint(GetScriptContext()->DeferredParsingThunk);
            }
            if (!CrossSite::IsThunk(functionType->GetEntryPointInfo()->jsMethod))
            {
                functionType->GetEntryPointInfo()->jsMethod = GetScriptContext()->DeferredParsingThunk;
            }
        });
    }